

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O2

void __thiscall
TEST_MockSupportTestWithFixture_failedMockShouldFailAgainWhenRepeated_TestShell::
~TEST_MockSupportTestWithFixture_failedMockShouldFailAgainWhenRepeated_TestShell
          (TEST_MockSupportTestWithFixture_failedMockShouldFailAgainWhenRepeated_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupportTestWithFixture, failedMockShouldFailAgainWhenRepeated)
{
    fixture.setTestFunction(unexpectedCallTestFunction_);
    int repeatCount = 2;
    while(repeatCount--)
    {
        fixture.runAllTests();
        fixture.assertPrintContains("Unexpected call to function: unexpected");
        fixture.assertPrintContains("Errors (1 failures, 1 tests, 1 ran, 0 checks, 0 ignored, 0 filtered out");
        fixture.flushOutputAndResetResult();
    }
}